

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  short sVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  float fVar6;
  float fVar7;
  ImGuiID IVar8;
  ImGuiTabItemFlags IVar9;
  int iVar10;
  int iVar11;
  ImGuiTabItem *pIVar12;
  uint uVar13;
  long lVar14;
  ImGuiTabItem *__src;
  ImGuiTabItem *__dest;
  uint uVar15;
  ImGuiTabItem *pIVar16;
  ImGuiTabItem item_tmp;
  undefined1 uStack_28;
  undefined3 uStack_27;
  undefined5 uStack_24;
  
  if (tab_bar->ReorderRequestTabId == 0) {
    return false;
  }
  uVar2 = (tab_bar->Tabs).Size;
  if (0 < (long)(int)uVar2) {
    pIVar16 = (tab_bar->Tabs).Data;
    lVar14 = 0;
    pIVar12 = pIVar16;
    do {
      if (pIVar12->ID == tab_bar->ReorderRequestTabId) {
        if ((pIVar12->Flags & 0x20U) != 0) {
          return false;
        }
        sVar1 = tab_bar->ReorderRequestOffset;
        uVar13 = (uint)sVar1;
        uVar15 = uVar13 - (int)lVar14;
        if (uVar2 <= uVar15) {
          return false;
        }
        if ((pIVar16[uVar15].Flags & 0x20U) != 0) {
          return false;
        }
        if (((pIVar16[uVar15].Flags ^ pIVar12->Flags) & 0xc0U) != 0) {
          return false;
        }
        pIVar16 = pIVar16 + uVar15;
        IVar8 = pIVar12->ID;
        IVar9 = pIVar12->Flags;
        iVar10 = pIVar12->LastFrameVisible;
        iVar11 = pIVar12->LastFrameSelected;
        fVar6 = pIVar12->Offset;
        fVar7 = pIVar12->Width;
        uVar3._0_4_ = pIVar12->ContentWidth;
        uVar3._4_4_ = pIVar12->RequestedWidth;
        uVar4 = pIVar12->NameOffset;
        uVar5._0_2_ = pIVar12->BeginOrder;
        uVar5._2_2_ = pIVar12->IndexDuringLayout;
        uVar5._4_1_ = pIVar12->WantClose;
        uVar5._5_3_ = *(undefined3 *)&pIVar12->field_0x29;
        uStack_24 = (undefined5)uVar5;
        __src = pIVar12 + 1;
        if (sVar1 < 1) {
          __src = pIVar16;
        }
        __dest = pIVar16 + 1;
        if (0 < sVar1) {
          __dest = pIVar12;
        }
        uVar2 = -uVar13;
        if (0 < (int)uVar13) {
          uVar2 = uVar13;
        }
        memmove(__dest,__src,(ulong)uVar2 * 0x2c);
        uStack_28 = (undefined1)uVar4;
        uStack_27 = (undefined3)((uint)uVar4 >> 8);
        *(ulong *)((long)&pIVar16->ContentWidth + 1) = CONCAT17(uStack_28,(int7)((ulong)uVar3 >> 8))
        ;
        *(ulong *)((long)&pIVar16->NameOffset + 1) = CONCAT53(uStack_24,uStack_27);
        pIVar16->Offset = fVar6;
        pIVar16->Width = fVar7;
        pIVar16->ContentWidth = (float)(undefined4)uVar3;
        pIVar16->RequestedWidth = (float)uVar3._4_4_;
        pIVar16->ID = IVar8;
        pIVar16->Flags = IVar9;
        pIVar16->LastFrameVisible = iVar10;
        pIVar16->LastFrameSelected = iVar11;
        if ((tab_bar->Flags & 0x400000) != 0) {
          MarkIniSettingsDirty();
        }
        return true;
      }
      lVar14 = lVar14 + -1;
      pIVar12 = pIVar12 + 1;
    } while (-lVar14 != (long)(int)uVar2);
  }
  return false;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestOffset;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered tabs must share the same section
    // (Note: TabBarQueueReorderFromMousePos() also has a similar test but since we allow direct calls to TabBarQueueReorder() we do it here too)
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & ImGuiTabItemFlags_SectionMask_) != (tab2->Flags & ImGuiTabItemFlags_SectionMask_))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    ImGuiTabItem* src_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 + 1 : tab2;
    ImGuiTabItem* dst_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 : tab2 + 1;
    const int move_count = (tab_bar->ReorderRequestOffset > 0) ? tab_bar->ReorderRequestOffset : -tab_bar->ReorderRequestOffset;
    memmove(dst_tab, src_tab, move_count * sizeof(ImGuiTabItem));
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}